

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_join.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformJoin(Transformer *this,PGJoinExpr *root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  char *pcVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  PGAlias *root_00;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var6;
  undefined8 uVar7;
  pointer pJVar8;
  type ref;
  pointer pSVar9;
  pointer pSVar10;
  type ref_00;
  pointer pSVar11;
  NotImplementedException *this_00;
  JoinRefType JVar12;
  long in_RDX;
  long *plVar13;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> local_78;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_70;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_68;
  undefined1 local_60 [32];
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_40;
  __node_base local_38;
  
  local_60._0_8_ = local_60._0_8_ & 0xffffffffffffff00;
  make_uniq<duckdb::JoinRef,duckdb::JoinRefType>((duckdb *)&local_78,local_60);
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 0:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = INNER;
    break;
  case 1:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = LEFT;
    break;
  case 2:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = OUTER;
    break;
  case 3:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = RIGHT;
    break;
  case 4:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = SEMI;
    break;
  case 5:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->type = ANTI;
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_60,"Join type %d not supported\n",(allocator *)&local_68);
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGJoinType>
              (this_00,(string *)local_60,*(PGJoinType *)(in_RDX + 4));
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 8:
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    pJVar8->ref_type = POSITIONAL;
  }
  TransformTableRefNode((Transformer *)local_60,(PGNode *)root);
  pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_78);
  uVar7 = local_60._0_8_;
  local_60._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pJVar8->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar8->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar7;
  if ((_Var1._M_head_impl != (TableRef *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))(),
     (Transformer *)local_60._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  TransformTableRefNode((Transformer *)local_60,(PGNode *)root);
  pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_78);
  uVar7 = local_60._0_8_;
  local_60._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pJVar8->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar8->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar7;
  if ((_Var1._M_head_impl != (TableRef *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))(),
     (Transformer *)local_60._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  if (*(int *)(in_RDX + 8) == 1) {
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    JVar12 = NATURAL;
  }
  else {
    if (*(int *)(in_RDX + 8) != 2) goto LAB_00675cf6;
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    JVar12 = ASOF;
  }
  pJVar8->ref_type = JVar12;
LAB_00675cf6:
  ref = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator*
                  ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                   &local_78);
  SetQueryLocation(&ref->super_TableRef,*(int *)(in_RDX + 0x3c));
  plVar13 = *(long **)(in_RDX + 0x20);
  local_38._M_nxt = (_Hash_node_base *)this;
  if ((plVar13 == (long *)0x0) || (*(int *)((long)plVar13 + 4) < 1)) {
    if ((*(long *)(in_RDX + 0x28) == 0) &&
       ((pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                  operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                              *)&local_78),
        (pJVar8->using_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pJVar8->using_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish &&
        (pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                  operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                              *)&local_78), pJVar8->ref_type == REGULAR)))) {
      pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                         ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *
                          )&local_78);
      pJVar8->ref_type = CROSS;
    }
    TransformExpression((Transformer *)local_60,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_78);
    uVar7 = local_60._0_8_;
    local_60._0_8_ = (Transformer *)0x0;
    _Var3._M_head_impl =
         (pJVar8->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar8->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar7;
    if ((_Var3._M_head_impl != (ParsedExpression *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
       (Transformer *)local_60._0_8_ != (Transformer *)0x0)) {
      (**(code **)(*(long *)local_60._0_8_ + 8))();
    }
    if (*(long *)(in_RDX + 0x30) != 0) {
      make_uniq<duckdb::SelectNode>();
      pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_68);
      make_uniq<duckdb::StarExpression>();
      local_60._0_8_ = local_70._M_head_impl;
      local_70._M_head_impl = (SelectStatement *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar9->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_60);
      if ((Transformer *)local_60._0_8_ != (Transformer *)0x0) {
        (**(code **)(*(long *)local_60._0_8_ + 8))();
      }
      local_60._0_8_ = (Transformer *)0x0;
      if (local_70._M_head_impl != (SelectStatement *)0x0) {
        (*((local_70._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      _Var5._M_head_impl = local_78._M_head_impl;
      local_78._M_head_impl = (JoinRef *)0x0;
      pSVar9 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)&local_68);
      _Var1._M_head_impl =
           (pSVar9->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar9->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           &(_Var5._M_head_impl)->super_TableRef;
      if (_Var1._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
      }
      make_uniq<duckdb::SelectStatement>();
      _Var6._M_head_impl = local_68._M_head_impl;
      local_68._M_head_impl = (SelectNode *)0x0;
      pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                              *)&local_70);
      _Var4._M_head_impl =
           (pSVar10->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar10->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var6._M_head_impl)->super_QueryNode;
      if (_Var4._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var4._M_head_impl)->_vptr_QueryNode + 8))();
      }
      make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
                ((duckdb *)&local_40,
                 (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  *)&local_70);
      ref_00 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
               operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                          *)&local_40);
      SetQueryLocation(&ref_00->super_TableRef,*(int *)(in_RDX + 0x3c));
      root_00 = *(PGAlias **)(in_RDX + 0x30);
      pSVar11 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
                operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                            *)&local_40);
      TransformAlias((string *)local_60,(Transformer *)root,root_00,
                     &(pSVar11->super_TableRef).column_name_alias);
      pSVar11 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
                operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                            *)&local_40);
      ::std::__cxx11::string::operator=
                ((string *)&(pSVar11->super_TableRef).alias,(string *)local_60);
      ::std::__cxx11::string::~string((string *)local_60);
      (this->parent).ptr = (Transformer *)local_40._M_head_impl;
      if (local_70._M_head_impl != (SelectStatement *)0x0) {
        (*((local_70._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      if (local_68._M_head_impl != (SelectNode *)0x0) {
        (*((local_68._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      if (local_78._M_head_impl == (JoinRef *)0x0) {
        return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
      }
      (*((local_78._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
    }
  }
  else {
    while (plVar13 = (long *)plVar13[1], this = (Transformer *)local_38._M_nxt,
          plVar13 != (long *)0x0) {
      pcVar2 = *(char **)(*plVar13 + 8);
      pJVar8 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                         ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *
                          )&local_78);
      ::std::__cxx11::string::string((string *)local_60,pcVar2,(allocator *)&local_68);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pJVar8->using_columns,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      ::std::__cxx11::string::~string((string *)local_60);
    }
  }
  *(JoinRef **)this = local_78._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformJoin(duckdb_libpgquery::PGJoinExpr &root) {
	auto result = make_uniq<JoinRef>(JoinRefType::REGULAR);
	switch (root.jointype) {
	case duckdb_libpgquery::PG_JOIN_INNER: {
		result->type = JoinType::INNER;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_LEFT: {
		result->type = JoinType::LEFT;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_FULL: {
		result->type = JoinType::OUTER;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_RIGHT: {
		result->type = JoinType::RIGHT;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_SEMI: {
		result->type = JoinType::SEMI;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_ANTI: {
		result->type = JoinType::ANTI;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_POSITION: {
		result->ref_type = JoinRefType::POSITIONAL;
		break;
	}
	default:
		throw NotImplementedException("Join type %d not supported\n", root.jointype);
	}

	// Check the type of the left and right argument before transforming.
	result->left = TransformTableRefNode(*root.larg);
	result->right = TransformTableRefNode(*root.rarg);

	switch (root.joinreftype) {
	case duckdb_libpgquery::PG_JOIN_NATURAL:
		result->ref_type = JoinRefType::NATURAL;
		break;
	case duckdb_libpgquery::PG_JOIN_ASOF:
		result->ref_type = JoinRefType::ASOF;
		break;
	default:
		break;
	}

	SetQueryLocation(*result, root.location);
	if (root.usingClause && root.usingClause->length > 0) {
		// usingClause is a list of strings.
		for (auto node = root.usingClause->head; node != nullptr; node = node->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			D_ASSERT(target->type == duckdb_libpgquery::T_PGString);
			auto value = PGCast<duckdb_libpgquery::PGValue>(*target.get());
			result->using_columns.push_back(string(value.val.str));
		}
		return std::move(result);
	}

	// Check if this is a cross product.
	if (!root.quals && result->using_columns.empty() && result->ref_type == JoinRefType::REGULAR) {
		result->ref_type = JoinRefType::CROSS;
	}
	result->condition = TransformExpression(root.quals);

	if (root.alias) {
		// This is a join with an alias, so we wrap it in a subquery.
		auto select_node = make_uniq<SelectNode>();
		select_node->select_list.push_back(make_uniq<StarExpression>());
		select_node->from_table = std::move(result);

		auto select = make_uniq<SelectStatement>();
		select->node = std::move(select_node);

		auto subquery = make_uniq<SubqueryRef>(std::move(select));
		SetQueryLocation(*subquery, root.location);

		// Apply the alias to the subquery.
		subquery->alias = TransformAlias(root.alias, subquery->column_name_alias);
		return std::move(subquery);
	}
	return std::move(result);
}